

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O0

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseNumber<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  bool bVar1;
  Ch CVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  size_t sVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double local_3a8;
  ulong local_340;
  int p;
  char *decimal;
  size_t length;
  bool cont;
  int maxExp;
  bool expMinus;
  int exp;
  size_t decimalPosition;
  double dStack_238;
  int expFrac;
  double d;
  int iStack_228;
  bool useDouble;
  int significandDigit;
  bool use64bit;
  uint64_t i64;
  uint i;
  bool minus;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false> local_200;
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false> s;
  StreamLocalCopy<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_1> copy;
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  *handler_local;
  GenericStringStream<rapidjson::UTF8<char>_> *is_local;
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this_local;
  
  internal::StreamLocalCopy<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_1>::
  StreamLocalCopy((StreamLocalCopy<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_1> *)&s,
                  is);
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false>::NumberStream
            (&local_200,
             (GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *
             )this,(GenericStringStream<rapidjson::UTF8<char>_> *)&s);
  CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_200.is);
  bVar7 = CVar2 == '-';
  if (bVar7) {
    GenericStringStream<rapidjson::UTF8<char>_>::Take(local_200.is);
  }
  i64._4_4_ = 0;
  _significandDigit = 0;
  bVar1 = false;
  iStack_228 = 0;
  CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_200.is);
  if (CVar2 == '0') {
    i64._4_4_ = 0;
    GenericStringStream<rapidjson::UTF8<char>_>::Take(local_200.is);
  }
  else {
    CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_200.is);
    if ((CVar2 < '1') ||
       (CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_200.is), '9' < CVar2)) {
      bVar3 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                             *)this);
      if (((bVar3 ^ 0xffU) & 1) == 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                      ,0x335,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      sVar6 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false>::Tell
                        (&local_200);
      GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
      SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                     *)this,kParseErrorValueInvalid,sVar6);
      bVar3 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                             *)this);
      if (bVar3) goto LAB_00159b53;
    }
    else {
      CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Take(local_200.is);
      i64._4_4_ = (int)CVar2 - 0x30;
      if (bVar7) {
        while( true ) {
          CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_200.is);
          bVar3 = false;
          if ('/' < CVar2) {
            CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_200.is);
            bVar3 = CVar2 < ':';
          }
          if (!bVar3) goto LAB_0015892e;
          if ((0xccccccb < i64._4_4_) &&
             ((i64._4_4_ != 0xccccccc ||
              (CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_200.is), '8' < CVar2)
              ))) break;
          CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Take(local_200.is);
          i64._4_4_ = i64._4_4_ * 10 + CVar2 + -0x30;
          iStack_228 = iStack_228 + 1;
        }
        _significandDigit = (ulong)i64._4_4_;
        bVar1 = true;
      }
      else {
        while( true ) {
          CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_200.is);
          bVar3 = false;
          if ('/' < CVar2) {
            CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_200.is);
            bVar3 = CVar2 < ':';
          }
          if (!bVar3) goto LAB_0015892e;
          if ((0x19999998 < i64._4_4_) &&
             ((i64._4_4_ != 0x19999999 ||
              (CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_200.is), '5' < CVar2)
              ))) break;
          CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Take(local_200.is);
          i64._4_4_ = i64._4_4_ * 10 + CVar2 + -0x30;
          iStack_228 = iStack_228 + 1;
        }
        _significandDigit = (ulong)i64._4_4_;
        bVar1 = true;
      }
    }
  }
LAB_0015892e:
  bVar3 = false;
  dStack_238 = 0.0;
  if (bVar1) {
    if (bVar7) {
      while( true ) {
        CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_200.is);
        bVar4 = false;
        if ('/' < CVar2) {
          CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_200.is);
          bVar4 = CVar2 < ':';
        }
        if (!bVar4) goto LAB_00158c55;
        if ((0xccccccccccccccb < _significandDigit) &&
           ((_significandDigit != 0xccccccccccccccc ||
            (CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_200.is), '8' < CVar2)))
           ) break;
        CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Take(local_200.is);
        _significandDigit = _significandDigit * 10 + (ulong)((int)CVar2 - 0x30);
        iStack_228 = iStack_228 + 1;
      }
      auVar8._8_4_ = (int)(_significandDigit >> 0x20);
      auVar8._0_8_ = _significandDigit;
      auVar8._12_4_ = 0x45300000;
      dStack_238 = (auVar8._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)_significandDigit) - 4503599627370496.0);
      bVar3 = true;
    }
    else {
      while( true ) {
        CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_200.is);
        bVar4 = false;
        if ('/' < CVar2) {
          CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_200.is);
          bVar4 = CVar2 < ':';
        }
        if (!bVar4) goto LAB_00158c55;
        if ((0x1999999999999998 < _significandDigit) &&
           ((_significandDigit != 0x1999999999999999 ||
            (CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_200.is), '5' < CVar2)))
           ) break;
        CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Take(local_200.is);
        _significandDigit = _significandDigit * 10 + (ulong)((int)CVar2 - 0x30);
        iStack_228 = iStack_228 + 1;
      }
      auVar9._8_4_ = (int)(_significandDigit >> 0x20);
      auVar9._0_8_ = _significandDigit;
      auVar9._12_4_ = 0x45300000;
      dStack_238 = (auVar9._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)_significandDigit) - 4503599627370496.0);
      bVar3 = true;
    }
  }
LAB_00158c55:
  if (bVar3) {
    do {
      CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_200.is);
      bVar4 = false;
      if ('/' < CVar2) {
        CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_200.is);
        bVar4 = CVar2 < ':';
      }
      if (!bVar4) break;
      if (1.7976931348623158e+307 <= dStack_238) {
        bVar4 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                 *)this);
        if (((bVar4 ^ 0xffU) & 1) == 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                        ,0x357,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
        sVar6 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                ::NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false>::Tell
                          (&local_200);
        GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
        SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                       *)this,kParseErrorNumberTooBig,sVar6);
        bVar4 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                 *)this);
        if (bVar4) goto LAB_00159b53;
      }
      CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Take(local_200.is);
      dStack_238 = dStack_238 * 10.0 + (double)(CVar2 + -0x30);
    } while( true );
  }
  decimalPosition._4_4_ = 0;
  CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_200.is);
  if (CVar2 == '.') {
    GenericStringStream<rapidjson::UTF8<char>_>::Take(local_200.is);
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false>::Length(&local_200);
    CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_200.is);
    if ((CVar2 < '0') ||
       (CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_200.is), '9' < CVar2)) {
      bVar4 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                             *)this);
      if (((bVar4 ^ 0xffU) & 1) == 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                      ,0x364,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      sVar6 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false>::Tell
                        (&local_200);
      GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
      SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                     *)this,kParseErrorNumberMissFraction,sVar6);
      bVar4 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                             *)this);
      if (bVar4) goto LAB_00159b53;
    }
    if (!bVar3) {
      if (!bVar1) {
        _significandDigit = (ulong)i64._4_4_;
      }
      while( true ) {
        CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_200.is);
        bVar3 = false;
        if ('/' < CVar2) {
          CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_200.is);
          bVar3 = CVar2 < ':';
        }
        if ((!bVar3) || (0x1fffffffffffff < _significandDigit)) break;
        CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Take(local_200.is);
        _significandDigit = _significandDigit * 10 + (ulong)((int)CVar2 - 0x30);
        decimalPosition._4_4_ = decimalPosition._4_4_ + -1;
        if (_significandDigit != 0) {
          iStack_228 = iStack_228 + 1;
        }
      }
      auVar10._8_4_ = (int)(_significandDigit >> 0x20);
      auVar10._0_8_ = _significandDigit;
      auVar10._12_4_ = 0x45300000;
      dStack_238 = (auVar10._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)_significandDigit) - 4503599627370496.0);
      bVar3 = true;
    }
    while( true ) {
      CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_200.is);
      bVar4 = false;
      if ('/' < CVar2) {
        CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_200.is);
        bVar4 = CVar2 < ':';
      }
      if (!bVar4) break;
      if (iStack_228 < 0x11) {
        CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Take(local_200.is);
        dStack_238 = dStack_238 * 10.0 + (double)(CVar2 + -0x30);
        decimalPosition._4_4_ = decimalPosition._4_4_ + -1;
        if (0.0 < dStack_238) {
          iStack_228 = iStack_228 + 1;
        }
      }
      else {
        GenericStringStream<rapidjson::UTF8<char>_>::Take(local_200.is);
      }
    }
  }
  else {
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false>::Length(&local_200);
  }
  maxExp = 0;
  CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_200.is);
  if ((CVar2 == 'e') ||
     (CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_200.is), CVar2 == 'E')) {
    if (!bVar3) {
      if (bVar1) {
        local_340 = _significandDigit;
      }
      else {
        local_340 = (ulong)i64._4_4_;
      }
      auVar11._8_4_ = (int)(local_340 >> 0x20);
      auVar11._0_8_ = local_340;
      auVar11._12_4_ = 0x45300000;
      dStack_238 = (auVar11._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)local_340) - 4503599627370496.0);
      bVar3 = true;
    }
    GenericStringStream<rapidjson::UTF8<char>_>::Take(local_200.is);
    bVar4 = false;
    CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_200.is);
    if (CVar2 == '+') {
      GenericStringStream<rapidjson::UTF8<char>_>::Take(local_200.is);
    }
    else {
      CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_200.is);
      bVar4 = CVar2 == '-';
      if (bVar4) {
        GenericStringStream<rapidjson::UTF8<char>_>::Take(local_200.is);
      }
    }
    CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_200.is);
    if ((CVar2 < '0') ||
       (CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_200.is), '9' < CVar2)) {
      bVar5 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                             *)this);
      if (((bVar5 ^ 0xffU) & 1) == 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                      ,0x3b3,
                      "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                     );
      }
      sVar6 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false>::Tell
                        (&local_200);
      GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
      SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                     *)this,kParseErrorNumberMissExponent,sVar6);
      bVar5 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
              HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                             *)this);
      if (bVar5) goto LAB_00159b53;
    }
    else {
      CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Take(local_200.is);
      maxExp = CVar2 + -0x30;
      if (!bVar4) {
        do {
          do {
            CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_200.is);
            bVar5 = false;
            if ('/' < CVar2) {
              CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_200.is);
              bVar5 = CVar2 < ':';
            }
            if (!bVar5) goto LAB_0015988f;
            CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Take(local_200.is);
            maxExp = maxExp * 10 + CVar2 + -0x30;
          } while (maxExp <= 0x134 - decimalPosition._4_4_);
          bVar5 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                   *)this);
          if (((bVar5 ^ 0xffU) & 1) == 0) {
            __assert_fail("!HasParseError()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                          ,0x3ae,
                          "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                         );
          }
          sVar6 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false>::
                  Tell(&local_200);
          GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
          SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                         *)this,kParseErrorNumberTooBig,sVar6);
          bVar5 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                  ::HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                                   *)this);
        } while (!bVar5);
        goto LAB_00159b53;
      }
      while( true ) {
        CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_200.is);
        bVar5 = false;
        if ('/' < CVar2) {
          CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_200.is);
          bVar5 = CVar2 < ':';
        }
        if (!bVar5) break;
        CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Take(local_200.is);
        maxExp = maxExp * 10 + CVar2 + -0x30;
        if (0xccccccb < maxExp) {
          while( true ) {
            CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_200.is);
            bVar5 = false;
            if ('/' < CVar2) {
              CVar2 = GenericStringStream<rapidjson::UTF8<char>_>::Peek(local_200.is);
              bVar5 = CVar2 < ':';
            }
            if (!bVar5) break;
            GenericStringStream<rapidjson::UTF8<char>_>::Take(local_200.is);
          }
        }
      }
    }
LAB_0015988f:
    if (bVar4) {
      maxExp = -maxExp;
    }
  }
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false>::Length(&local_200);
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false>::Pop(&local_200);
  if (bVar3) {
    local_3a8 = internal::StrtodNormalPrecision(dStack_238,maxExp + decimalPosition._4_4_);
    if (bVar7) {
      local_3a8 = -local_3a8;
    }
    length._3_1_ = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                   ::Double(handler,local_3a8);
  }
  else if (bVar1) {
    if (bVar7) {
      length._3_1_ = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                     ::Int64(handler,-_significandDigit);
    }
    else {
      length._3_1_ = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                     ::Uint64(handler,_significandDigit);
    }
  }
  else if (bVar7) {
    length._3_1_ = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                   ::Int(handler,-i64._4_4_);
  }
  else {
    length._3_1_ = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                   ::Uint(handler,i64._4_4_);
  }
  if (length._3_1_ == false) {
    bVar7 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                           *)this);
    if (((bVar7 ^ 0xffU) & 1) == 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Snepsts[P]megaminerai-catastrophe/joueur/libraries/rapidjson/include/rapidjson/reader.h"
                    ,0x3d6,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    sVar6 = GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
            NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false>::Tell
                      (&local_200);
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    SetParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                   *)this,kParseErrorTermination,sVar6);
    GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
    HasParseError((GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
                   *)this);
  }
LAB_00159b53:
  GenericReader<rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
  NumberStream<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_false>::~NumberStream
            (&local_200);
  internal::StreamLocalCopy<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_1>::
  ~StreamLocalCopy((StreamLocalCopy<rapidjson::GenericStringStream<rapidjson::UTF8<char>_>,_1> *)&s)
  ;
  return;
}

Assistant:

void ParseNumber(InputStream& is, Handler& handler) {
        internal::StreamLocalCopy<InputStream> copy(is);
        NumberStream<InputStream, (parseFlags & kParseFullPrecisionFlag) != 0> s(*this, copy.s);

        // Parse minus
        bool minus = false;
        if (s.Peek() == '-') {
            minus = true;
            s.Take();
        }

        // Parse int: zero / ( digit1-9 *DIGIT )
        unsigned i = 0;
        uint64_t i64 = 0;
        bool use64bit = false;
        int significandDigit = 0;
        if (s.Peek() == '0') {
            i = 0;
            s.TakePush();
        }
        else if (s.Peek() >= '1' && s.Peek() <= '9') {
            i = static_cast<unsigned>(s.TakePush() - '0');

            if (minus)
                while (s.Peek() >= '0' && s.Peek() <= '9') {
                    if (i >= 214748364) { // 2^31 = 2147483648
                        if (i != 214748364 || s.Peek() > '8') {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (s.Peek() >= '0' && s.Peek() <= '9') {
                    if (i >= 429496729) { // 2^32 - 1 = 4294967295
                        if (i != 429496729 || s.Peek() > '5') {
                            i64 = i;
                            use64bit = true;
                            break;
                        }
                    }
                    i = i * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }
        else
            RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, s.Tell());

        // Parse 64bit int
        bool useDouble = false;
        double d = 0.0;
        if (use64bit) {
            if (minus) 
                while (s.Peek() >= '0' && s.Peek() <= '9') {                    
                     if (i64 >= RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC)) // 2^63 = 9223372036854775808
                        if (i64 != RAPIDJSON_UINT64_C2(0x0CCCCCCC, 0xCCCCCCCC) || s.Peek() > '8') {
                            d = i64;
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
            else
                while (s.Peek() >= '0' && s.Peek() <= '9') {                    
                    if (i64 >= RAPIDJSON_UINT64_C2(0x19999999, 0x99999999)) // 2^64 - 1 = 18446744073709551615
                        if (i64 != RAPIDJSON_UINT64_C2(0x19999999, 0x99999999) || s.Peek() > '5') {
                            d = i64;
                            useDouble = true;
                            break;
                        }
                    i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                    significandDigit++;
                }
        }

        // Force double for big integer
        if (useDouble) {
            while (s.Peek() >= '0' && s.Peek() <= '9') {
                if (d >= 1.7976931348623157e307) // DBL_MAX / 10.0
                    RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, s.Tell());
                d = d * 10 + (s.TakePush() - '0');
            }
        }

        // Parse frac = decimal-point 1*DIGIT
        int expFrac = 0;
        size_t decimalPosition;
        if (s.Peek() == '.') {
            s.Take();
            decimalPosition = s.Length();

            if (!(s.Peek() >= '0' && s.Peek() <= '9'))
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissFraction, s.Tell());

            if (!useDouble) {
#if RAPIDJSON_64BIT
                // Use i64 to store significand in 64-bit architecture
                if (!use64bit)
                    i64 = i;
        
                while (s.Peek() >= '0' && s.Peek() <= '9') {
                    if (i64 > RAPIDJSON_UINT64_C2(0x1FFFFF, 0xFFFFFFFF)) // 2^53 - 1 for fast path
                        break;
                    else {
                        i64 = i64 * 10 + static_cast<unsigned>(s.TakePush() - '0');
                        --expFrac;
                        if (i64 != 0)
                            significandDigit++;
                    }
                }

                d = (double)i64;
#else
                // Use double to store significand in 32-bit architecture
                d = use64bit ? (double)i64 : (double)i;
#endif
                useDouble = true;
            }

            while (s.Peek() >= '0' && s.Peek() <= '9') {
                if (significandDigit < 17) {
                    d = d * 10.0 + (s.TakePush() - '0');
                    --expFrac;
                    if (d > 0.0)
                        significandDigit++;
                }
                else
                    s.TakePush();
            }
        }
        else
            decimalPosition = s.Length(); // decimal position at the end of integer.

        // Parse exp = e [ minus / plus ] 1*DIGIT
        int exp = 0;
        if (s.Peek() == 'e' || s.Peek() == 'E') {
            if (!useDouble) {
                d = use64bit ? i64 : i;
                useDouble = true;
            }
            s.Take();

            bool expMinus = false;
            if (s.Peek() == '+')
                s.Take();
            else if (s.Peek() == '-') {
                s.Take();
                expMinus = true;
            }

            if (s.Peek() >= '0' && s.Peek() <= '9') {
                exp = s.Take() - '0';
                if (expMinus) {
                    while (s.Peek() >= '0' && s.Peek() <= '9') {
                        exp = exp * 10 + (s.Take() - '0');
                        if (exp >= 214748364) {                         // Issue #313: prevent overflow exponent
                            while (s.Peek() >= '0' && s.Peek() <= '9')  // Consume the rest of exponent
                                s.Take();
                        }
                    }
                }
                else {  // positive exp
                    int maxExp = 308 - expFrac;
                    while (s.Peek() >= '0' && s.Peek() <= '9') {
                        exp = exp * 10 + (s.Take() - '0');
                        if (exp > maxExp)
                            RAPIDJSON_PARSE_ERROR(kParseErrorNumberTooBig, s.Tell());
                    }
                }
            }
            else
                RAPIDJSON_PARSE_ERROR(kParseErrorNumberMissExponent, s.Tell());

            if (expMinus)
                exp = -exp;
        }

        // Finish parsing, call event according to the type of number.
        bool cont = true;
        size_t length = s.Length();
        const char* decimal = s.Pop();  // Pop stack no matter if it will be used or not.

        if (useDouble) {
            int p = exp + expFrac;
            if (parseFlags & kParseFullPrecisionFlag)
                d = internal::StrtodFullPrecision(d, p, decimal, length, decimalPosition, exp);
            else
                d = internal::StrtodNormalPrecision(d, p);

            cont = handler.Double(minus ? -d : d);
        }
        else {
            if (use64bit) {
                if (minus)
                    cont = handler.Int64(static_cast<int64_t>(~i64 + 1));
                else
                    cont = handler.Uint64(i64);
            }
            else {
                if (minus)
                    cont = handler.Int(static_cast<int32_t>(~i + 1));
                else
                    cont = handler.Uint(i);
            }
        }
        if (!cont)
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, s.Tell());
    }